

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int nni_file_lock(char *path,nni_file_lockh **hp)

{
  nni_plat_flock *lk;
  int rv;
  nni_file_lockh *h;
  nni_file_lockh **hp_local;
  char *path_local;
  
  lk = (nni_plat_flock *)nni_zalloc(4);
  if (lk == (nni_plat_flock *)0x0) {
    path_local._4_4_ = 2;
  }
  else {
    path_local._4_4_ = nni_plat_file_lock(path,lk);
    if (path_local._4_4_ == 0) {
      *hp = (nni_file_lockh *)lk;
      path_local._4_4_ = 0;
    }
    else {
      nni_free(lk,4);
    }
  }
  return path_local._4_4_;
}

Assistant:

int
nni_file_lock(const char *path, nni_file_lockh **hp)
{
	nni_file_lockh *h;
	int             rv;
	if ((h = NNI_ALLOC_STRUCT(h)) == NULL) {
		return (NNG_ENOMEM);
	}
	rv = nni_plat_file_lock(path, &h->lk);
	if (rv != 0) {
		NNI_FREE_STRUCT(h);
		return (rv);
	}
	*hp = h;
	return (0);
}